

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O3

Data * Data::newData(string *str)

{
  char cVar1;
  int iVar2;
  Integer *this;
  long value;
  stringstream temp;
  long local_1a0;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  cVar1 = *(str->_M_dataplus)._M_p;
  if (cVar1 == '-' || (byte)(cVar1 - 0x30U) < 10) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,(str->_M_dataplus)._M_p,str->_M_string_length);
    std::istream::_M_extract<long>((long *)local_198);
    this = (Integer *)operator_new(0x18);
    Integer::Integer(this,&local_1a0);
    std::__cxx11::stringstream::~stringstream(local_198);
    std::ios_base::~ios_base(local_118);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)str);
    this = (Integer *)trueData;
    if ((iVar2 != 0) &&
       (iVar2 = std::__cxx11::string::compare((char *)str), this = (Integer *)falseData, iVar2 != 0)
       ) {
      this = (Integer *)0x0;
    }
  }
  return &this->super_Data;
}

Assistant:

Data *Data::newData(const std::string &str) {
    if (str[0] == '-' || (str[0] <= '9' && str[0] >= '0')) {
        std::stringstream temp;
        long value;
        temp << str;
        temp >> value;
        return new Integer(value);
    } else if (str == "true") {
        return Data::trueData;
    } else if (str == "false") {
        return Data::falseData;
    } else return NULL;
}